

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ab9709::Codemodel::DumpPaths(Value *__return_storage_ptr__,Codemodel *this)

{
  cmake *pcVar1;
  string *psVar2;
  Value *pVVar3;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  Codemodel *local_18;
  Codemodel *this_local;
  Value *paths;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Codemodel *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  pcVar1 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  psVar2 = cmake::GetHomeDirectory_abi_cxx11_(pcVar1);
  Json::Value::Value(&local_48,psVar2);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"source");
  Json::Value::operator=(pVVar3,&local_48);
  Json::Value::~Value(&local_48);
  pcVar1 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar1);
  Json::Value::Value(&local_80,psVar2);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"build");
  Json::Value::operator=(pVVar3,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Codemodel::DumpPaths()
{
  Json::Value paths = Json::objectValue;
  paths["source"] = this->FileAPI.GetCMakeInstance()->GetHomeDirectory();
  paths["build"] = this->FileAPI.GetCMakeInstance()->GetHomeOutputDirectory();
  return paths;
}